

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_result.cc
# Opt level: O1

result<std::string,_std::string> *
v2::divide(result<std::string,_std::string> *__return_storage_ptr__,string *s1,string *s2)

{
  pointer pcVar1;
  ostream *poVar2;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar4;
  _Array_type *fn;
  result<int,_ErrorMsg> a;
  return_type c;
  result<int,_ErrorMsg> b;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> local_c4;
  undefined1 local_c0 [32];
  byte local_a0;
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(s1->_M_dataplus)._M_p,s1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," / ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(s2->_M_dataplus)._M_p,s2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ?\n",5);
  to_int((result<int,_ErrorMsg> *)&local_98,s1);
  to_int((result<int,_ErrorMsg> *)&local_48,s2);
  if (local_98.
      super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index == 0) {
    pvVar4 = std::get<0ul,int,std::__cxx11::string>(&local_98);
    local_c4 = *pvVar4;
    fn = (_Array_type *)&local_c4;
    local_c0._0_8_ = fn;
    ezy::features::result_interface<ezy::features::result_adapter>::
    impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>>
    ::_impl::
    map<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>,ezy::features::result_adapter<std::variant<int,std::__cxx11::string>>,ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>const&,ezy::experimental::curried_with_args<std::divides<void>,int&>>
              ((strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
                *)&local_70,(_impl *)&local_48,
               (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
                *)local_c0,(curried_with_args<std::divides<void>,_int_&> *)fn);
  }
  else {
    pvVar3 = std::get<1ul,int,std::__cxx11::string>(&local_98);
    local_c0._0_8_ = local_c0 + 0x10;
    pcVar1 = (pvVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar1,pcVar1 + pvVar3->_M_string_length);
    local_a0 = 1;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base(&local_70,
                      (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_c0);
    fn = &std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_a0]._M_data)
              ((anon_class_1_0_00000001 *)&local_c4,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c0);
  }
  ezy::features::result_interface<ezy::features::result_adapter>::
  impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>>
  ::_impl::
  map<ezy::strong_type<std::variant<std::__cxx11::string,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>,ezy::features::result_adapter<std::variant<std::__cxx11::string,std::__cxx11::string>>,ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>const&,ezy::to_string_fn_const&>
            (__return_storage_ptr__,(_impl *)&local_70,
             (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
              *)&ezy::cpo::to_string,(to_string_fn *)fn);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_70.super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)local_c0,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_70);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_48.
     super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)local_c0,&local_48);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_98.
     super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)local_c0,&local_98);
  return __return_storage_ptr__;
}

Assistant:

ezy::result<std::string, std::string>
  divide(const std::string& s1, const std::string& s2)
  {
    std::cout << s1 << " / " << s2 << " = ?\n";
    const auto a = to_int(s1);
    const auto b = to_int(s2);

    static constexpr auto div = ezy::experimental::curry(std::divides<>{});

    const auto c = a.and_then(
        [&b](auto x) {
          return b.map(div(x));
        }
        );

    return c.map(ezy::to_string);
  }